

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

void __thiscall ON_SerialNumberMap::Internal_HashTableGrow(ON_SerialNumberMap *this)

{
  SN_ELEMENT ***pppSVar1;
  SN_ELEMENT **ppSVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((this->m_hash_capacity <= this->m_active_id_count) &&
     (uVar3 = this->m_hash_block_count, uVar3 < 0xffa)) {
    uVar4 = (ulong)(uVar3 * 2) - 1;
    uVar6 = (ulong)(uVar3 * 2) * 0x3fe8 - 0x3fe8;
    do {
      uVar4 = uVar4 + 1;
      uVar6 = uVar6 + 0x3fe8;
    } while (uVar6 <= this->m_active_id_count);
    uVar6 = 0xffa;
    if (uVar4 < 0xffa) {
      uVar6 = uVar4;
    }
    uVar5 = 1;
    if (uVar4 != 0) {
      uVar5 = (uint)uVar6;
    }
    if (uVar3 < uVar5) {
      if (uVar3 == 0) {
        pppSVar1 = (SN_ELEMENT ***)onmalloc(0xffa0);
        this->m_hash_table_blocks = pppSVar1;
        *pppSVar1 = (SN_ELEMENT **)(pppSVar1 + 0xffa);
        this->m_hash_block_count = 1;
      }
      uVar3 = this->m_hash_block_count;
      while (uVar3 < uVar5) {
        ppSVar2 = (SN_ELEMENT **)onmalloc(0x7fd0);
        uVar3 = this->m_hash_block_count;
        this->m_hash_table_blocks[uVar3] = ppSVar2;
        if (this->m_hash_table_blocks[uVar3] == (SN_ELEMENT **)0x0) break;
        uVar3 = uVar3 + 1;
        this->m_hash_block_count = uVar3;
      }
      this->m_hash_capacity = (ulong)this->m_hash_block_count * 0x3fe8;
      if ((this->m_bHashTableIsValid != '\0') || (this->m_active_id_count == 0)) {
        if (this->m_bHashTableIsValid != '\0') {
          this->m_bHashTableIsValid = '\0';
        }
        Internal_HashTableInitialize(this);
        return;
      }
    }
  }
  return;
}

Assistant:

void ON_SerialNumberMap::Internal_HashTableGrow() const
{
  if (m_active_id_count >= m_hash_capacity && m_hash_block_count < ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY)
  {
    // Add capacity to the hash table.

    ON__UINT64 sz = (2U*m_hash_block_count);
    const ON__UINT32 target_linked_list_length = 4U;
    while (sz*((ON__UINT64)(target_linked_list_length*ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY)) <= m_active_id_count)
      sz++;
    const ON__UINT64 max_hash_block_count = (ON__UINT64)ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY;
    ON__UINT32 hash_block_count = (ON__UINT32)((sz < max_hash_block_count) ? sz : max_hash_block_count);
    if ( 0 == hash_block_count )
      hash_block_count = 1;
    if (m_hash_block_count < hash_block_count )
    {
      const size_t sizeof_hash_table_block = ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY*sizeof(m_hash_table_blocks[0][0]);
      if (0 == m_hash_block_count)
      {
        m_hash_table_blocks = (SN_ELEMENT***)onmalloc(2 * sizeof_hash_table_block);
        m_hash_table_blocks[0] = (SN_ELEMENT**)(m_hash_table_blocks + ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY);
        m_hash_block_count = 1;
      }
      while (m_hash_block_count < hash_block_count)
      {
        m_hash_table_blocks[m_hash_block_count] = (SN_ELEMENT**)onmalloc(sizeof_hash_table_block);
        if (nullptr == m_hash_table_blocks[m_hash_block_count])
          break;
        m_hash_block_count++;
      }

      m_hash_capacity = target_linked_list_length*ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY;
      m_hash_capacity *= m_hash_block_count;
      if (m_bHashTableIsValid || 0 == m_active_id_count)
      {
        // Invalidate() is necessary in order for Initialize()
        // to rebuild the has information.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        Internal_HashTableInitialize();
      }
    }
  }
}